

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yin.c
# Opt level: O2

int lyp_yin_parse_complex_ext
              (lys_module *mod,lys_ext_instance_complex *ext,lyxml_elem *yin,unres_schema *unres)

{
  long lVar1;
  lyxml_elem *plVar2;
  lyxml_ns *plVar3;
  lyxml_elem *elem;
  LYEXT_SUBSTMT type;
  LY_STMT *pLVar4;
  int iVar5;
  LY_ERR *pLVar6;
  lys_tpdf *tpdf;
  lys_iffeature *iffeat;
  ushort *puVar7;
  ushort **ppuVar8;
  undefined4 *puVar9;
  lyext_substmt *plVar10;
  lys_when *plVar11;
  lys_revision *rev;
  lys_unique *unique;
  lys_node **pplVar12;
  lys_module *plVar13;
  void **ppvVar14;
  lys_restr *must;
  char *pcVar15;
  void *pvVar16;
  undefined8 *puVar17;
  size_t sVar18;
  ushort uVar19;
  LY_STMT LVar20;
  LYS_NODE type_00;
  lys_node *ext_00;
  LY_ECODE ecode;
  ly_ctx *plVar21;
  uint8_t i;
  char *pcVar22;
  lyxml_elem *node;
  uint uVar23;
  lyext_substmt *plVar24;
  lyxml_elem **pplVar25;
  long lVar26;
  LYEXT_SUBSTMT LStackY_b0;
  uint16_t mask;
  uint16_t val1;
  uint16_t val2;
  lyext_substmt *local_80;
  char *local_78;
  char *endptr;
  lyext_substmt *local_68;
  lyext_substmt *info;
  lyext_substmt *local_58;
  unres_schema *local_50;
  lys_node *local_48;
  lyext_substmt *local_40;
  int local_34;
  
  local_34 = 1;
  node = yin->child;
  local_50 = unres;
  local_48 = (lys_node *)ext;
  do {
    while( true ) {
      ext_00 = local_48;
      if (node == (lyxml_elem *)0x0) {
        if ((local_48->parent != (lys_node *)0x0) &&
           (iVar5 = lyp_mand_check_ext((lys_ext_instance_complex *)local_48,yin->name), iVar5 != 0))
        {
          return local_34;
        }
        return 0;
      }
      plVar2 = node->next;
      plVar3 = node->ns;
      if (plVar3 != (lyxml_ns *)0x0) break;
LAB_0012eec1:
      lyxml_free(mod->ctx,node);
      node = plVar2;
    }
    if (((plVar3 == yin->ns) && ((local_48->flags & 1) != 0)) &&
       (pcVar15 = node->name,
       (lyext_substmt *)pcVar15 == (lyext_substmt *)((lys_ext *)local_48->name)->argument)) {
      if (local_48->ref != (char *)0x0) {
        plVar21 = mod->ctx;
LAB_00130395:
        pcVar22 = yin->name;
LAB_00130399:
        ecode = LYE_TOOMANY;
        goto LAB_001303a0;
      }
      local_48->ref = node->content;
      node->content = (char *)0x0;
      goto LAB_0012eec1;
    }
    iVar5 = strcmp(plVar3->value,"urn:ietf:params:xml:ns:yang:yin:1");
    if (iVar5 != 0) {
      LStackY_b0 = LYEXT_SUBSTMT_SELF;
LAB_0012e94f:
      iVar5 = lyp_yin_parse_subnode_ext(mod,ext_00,LYEXT_PAR_EXTINST,node,LStackY_b0,'\0',local_50);
      goto LAB_0012eeb9;
    }
    pcVar15 = node->name;
    iVar5 = strcmp(pcVar15,"description");
    if (iVar5 == 0) {
      LVar20 = LY_STMT_DESCRIPTION;
LAB_0012ee6e:
      iVar5 = 1;
      pcVar15 = "text";
LAB_0012eeb4:
      iVar5 = yin_parse_extcomplex_str
                        (mod,node,(lys_ext_instance_complex *)ext_00,LVar20,iVar5,pcVar15,local_50);
LAB_0012eeb9:
      if (iVar5 != 0) {
        return local_34;
      }
      goto LAB_0012eec1;
    }
    iVar5 = strcmp(pcVar15,"reference");
    if (iVar5 == 0) {
      LVar20 = LY_STMT_REFERENCE;
      goto LAB_0012ee6e;
    }
    iVar5 = strcmp(pcVar15,"units");
    if (iVar5 == 0) {
      LVar20 = LY_STMT_UNITS;
LAB_0012eea9:
      iVar5 = 0;
      pcVar15 = "name";
      goto LAB_0012eeb4;
    }
    iVar5 = strcmp(pcVar15,"type");
    if (iVar5 != 0) {
      iVar5 = strcmp(pcVar15,"typedef");
      if (iVar5 != 0) {
        iVar5 = strcmp(pcVar15,"if-feature");
        if (iVar5 == 0) {
          ppvVar14 = yin_getplace_for_extcomplex_struct
                               (node,(lys_ext_instance_complex *)ext_00,LY_STMT_IFFEATURE);
          if (ppvVar14 == (void **)0x0) {
            return local_34;
          }
          iffeat = (lys_iffeature *)calloc(1,0x20);
          *ppvVar14 = iffeat;
          if (iffeat == (lys_iffeature *)0x0) goto LAB_001303a9;
          iVar5 = fill_yin_iffeature(local_48,0,node,iffeat,local_50);
          goto LAB_0012eeb9;
        }
        iVar5 = strcmp(pcVar15,"status");
        if (iVar5 == 0) {
          puVar7 = (ushort *)
                   yin_getplace_for_extcomplex_flags
                             (node,(lys_ext_instance_complex *)ext_00,LY_STMT_STATUS,0x38);
          if (puVar7 == (ushort *)0x0) {
            return local_34;
          }
          pcVar15 = lyxml_get_attr(node,"value",(char *)0x0);
          if ((lyext_substmt *)pcVar15 != (lyext_substmt *)0x0) {
            iVar5 = strcmp(pcVar15,"current");
            if (iVar5 == 0) {
              uVar19 = 8;
            }
            else {
              iVar5 = strcmp(pcVar15,"deprecated");
              if (iVar5 == 0) {
                uVar19 = 0x10;
              }
              else {
                iVar5 = strcmp(pcVar15,"obsolete");
                uVar19 = 0x20;
                if (iVar5 != 0) {
                  plVar21 = mod->ctx;
                  pcVar22 = node->name;
                  ecode = LYE_INARG;
                  goto LAB_001303a0;
                }
              }
            }
            *puVar7 = *puVar7 | uVar19;
            LStackY_b0 = LYEXT_SUBSTMT_STATUS;
            ext_00 = local_48;
            goto LAB_0012e94f;
          }
LAB_001303d5:
          plVar21 = mod->ctx;
LAB_001303d8:
          pcVar22 = node->name;
LAB_001303dc:
          pcVar15 = "value";
          ecode = LYE_MISSARG;
          goto LAB_001303a0;
        }
        iVar5 = strcmp(pcVar15,"config");
        if (iVar5 == 0) {
          val2 = 6;
          val1 = 5;
          mask = 3;
LAB_0012f083:
          LVar20 = LY_STMT_MANDATORY;
          pcVar15 = "true";
          pcVar22 = "false";
LAB_0012f09d:
          iVar5 = yin_parse_extcomplex_flag
                            (mod,node,(lys_ext_instance_complex *)ext_00,LVar20,pcVar15,pcVar22,mask
                             ,val1,val2,local_50);
          goto LAB_0012eeb9;
        }
        iVar5 = strcmp(pcVar15,"argument");
        if (iVar5 == 0) {
          LVar20 = LY_STMT_ARGUMENT;
          goto LAB_0012eea9;
        }
        iVar5 = strcmp(pcVar15,"default");
        if (iVar5 != 0) {
          iVar5 = strcmp(pcVar15,"mandatory");
          if (iVar5 == 0) {
            val2 = 0x80;
            val1 = 0x40;
            mask = 0xc0;
            goto LAB_0012f083;
          }
          iVar5 = strcmp(pcVar15,"error-app-tag");
          if (iVar5 == 0) {
            LVar20 = LY_STMT_ERRTAG;
            goto LAB_0012f1e1;
          }
          iVar5 = strcmp(pcVar15,"error-message");
          if (iVar5 == 0) {
            LVar20 = LY_STMT_ERRMSG;
            iVar5 = 1;
            goto LAB_0012f1e5;
          }
          iVar5 = strcmp(pcVar15,"prefix");
          if (iVar5 == 0) {
            LVar20 = LY_STMT_PREFIX;
            goto LAB_0012f1e1;
          }
          iVar5 = strcmp(pcVar15,"namespace");
          if (iVar5 == 0) {
            LVar20 = LY_STMT_NAMESPACE;
            iVar5 = 0;
            pcVar15 = "uri";
            goto LAB_0012eeb4;
          }
          iVar5 = strcmp(pcVar15,"presence");
          if (iVar5 == 0) {
            LVar20 = LY_STMT_PRESENCE;
            goto LAB_0012f1e1;
          }
          iVar5 = strcmp(pcVar15,"revision-date");
          if (iVar5 == 0) {
            LVar20 = LY_STMT_REVISIONDATE;
            iVar5 = 0;
            pcVar15 = "date";
            goto LAB_0012eeb4;
          }
          iVar5 = strcmp(pcVar15,"key");
          if (iVar5 == 0) {
            LVar20 = LY_STMT_KEY;
            goto LAB_0012f1e1;
          }
          iVar5 = strcmp(pcVar15,"base");
          if (iVar5 == 0) {
            LVar20 = LY_STMT_BASE;
            goto LAB_0012eea9;
          }
          iVar5 = strcmp(pcVar15,"ordered-by");
          if (iVar5 == 0) {
            val2 = 0;
            val1 = 0x100;
            mask = 0x100;
            LVar20 = LY_STMT_ORDEREDBY;
            pcVar15 = "user";
            pcVar22 = "system";
            goto LAB_0012f09d;
          }
          iVar5 = strcmp(pcVar15,"belongs-to");
          if (iVar5 == 0) {
            LVar20 = LY_STMT_BELONGSTO;
            iVar5 = 0;
            pcVar15 = "module";
            goto LAB_0012eeb4;
          }
          iVar5 = strcmp(pcVar15,"contact");
          if (iVar5 == 0) {
            LVar20 = LY_STMT_CONTACT;
          }
          else {
            iVar5 = strcmp(pcVar15,"organization");
            if (iVar5 != 0) {
              iVar5 = strcmp(pcVar15,"path");
              if (iVar5 == 0) {
                LVar20 = LY_STMT_PATH;
                ext_00 = local_48;
                goto LAB_0012f1e1;
              }
              iVar5 = strcmp(pcVar15,"require-instance");
              if (iVar5 == 0) {
                LVar20 = LY_STMT_REQINSTANCE;
                pcVar15 = "true";
                pcVar22 = "false";
              }
              else {
                iVar5 = strcmp(pcVar15,"modifier");
                if (iVar5 != 0) {
                  iVar5 = strcmp(pcVar15,"fraction-digits");
                  if (iVar5 == 0) {
                    local_40 = (lyext_substmt *)
                               lys_ext_complex_get_substmt
                                         (LY_STMT_DIGITS,(lys_ext_instance_complex *)local_48,
                                          &local_68);
                    if (local_40 != (lyext_substmt *)0x0) {
                      if (local_68->cardinality < LY_STMT_CARD_SOME) {
                        if ((char)local_40->stmt != LY_STMT_UNKNOWN) {
LAB_00130420:
                          plVar21 = mod->ctx;
                          yin = node->parent;
                          pcVar15 = node->name;
                          goto LAB_00130395;
                        }
                        local_58 = (lyext_substmt *)0x0;
                        uVar23 = 0;
                      }
                      else {
                        pvVar16 = *(void **)local_40;
                        if (pvVar16 == (void *)0x0) {
                          pvVar16 = malloc(2);
                          *(void **)local_40 = pvVar16;
                          if (pvVar16 == (void *)0x0) goto LAB_001303a9;
                          uVar23 = 0;
                        }
                        else {
                          lVar26 = 0;
                          do {
                            pcVar15 = (char *)((long)pvVar16 + lVar26);
                            lVar26 = lVar26 + 1;
                          } while (*pcVar15 != '\0');
                          uVar23 = (int)lVar26 - 1;
                        }
                        local_58 = local_40;
                        local_40 = (lyext_substmt *)((ulong)uVar23 + (long)pvVar16);
                      }
                      info = (lyext_substmt *)lyxml_get_attr(node,"value",(char *)0x0);
                      if (info != (lyext_substmt *)0x0) {
                        lVar26 = strtol((char *)info,(char **)0x0,10);
                        if (lVar26 - 0x13U < 0xffffffffffffffee) {
                          plVar21 = mod->ctx;
                          pcVar22 = node->name;
                          ecode = LYE_INARG;
                          pcVar15 = (char *)info;
                          goto LAB_001303a0;
                        }
                        iVar5 = lyp_yin_parse_subnode_ext
                                          (mod,local_48,LYEXT_PAR_EXTINST,node,LYEXT_SUBSTMT_STATUS,
                                           (uint8_t)uVar23,local_50);
                        if (iVar5 != 0) {
                          return local_34;
                        }
                        *(char *)&local_40->stmt = (char)lVar26;
                        if (local_58 != (lyext_substmt *)0x0) {
                          pvVar16 = realloc(*(void **)local_58,(long)(int)uVar23 * 8 + 0x10);
                          if (pvVar16 == (void *)0x0) goto LAB_001303a9;
                          *(void **)local_58 = pvVar16;
                          *(undefined1 *)((long)pvVar16 + (long)(int)uVar23 + 1) = 0;
                        }
                        goto LAB_0012eec1;
                      }
                      goto LAB_001303d5;
                    }
                  }
                  else {
                    iVar5 = strcmp(pcVar15,"max-elements");
                    if (iVar5 == 0) {
                      local_40 = (lyext_substmt *)
                                 lys_ext_complex_get_substmt
                                           (LY_STMT_MAX,(lys_ext_instance_complex *)local_48,
                                            &local_68);
                      if (local_40 != (lyext_substmt *)0x0) {
                        pvVar16 = *(void **)local_40;
                        if (local_68->cardinality < LY_STMT_CARD_SOME) {
                          if (pvVar16 != (void *)0x0) goto LAB_00130420;
                          local_58 = (lyext_substmt *)0x0;
                          uVar23 = 0;
                        }
                        else {
                          if (pvVar16 == (void *)0x0) {
                            pvVar16 = malloc(0x10);
                            *(void **)local_40 = pvVar16;
                            if (pvVar16 == (void *)0x0) goto LAB_001303a9;
                            uVar23 = 0;
                          }
                          else {
                            lVar26 = 0;
                            do {
                              lVar1 = lVar26 * 8;
                              lVar26 = lVar26 + 1;
                            } while (*(long *)((long)pvVar16 + lVar1) != 0);
                            uVar23 = (int)lVar26 - 1;
                          }
                          local_58 = local_40;
                          local_40 = (lyext_substmt *)((long)pvVar16 + (ulong)uVar23 * 8);
                        }
                        pcVar15 = lyxml_get_attr(node,"value",(char *)0x0);
                        if (pcVar15 == (char *)0x0) goto LAB_001303d5;
                        ppuVar8 = __ctype_b_loc();
                        pcVar15 = pcVar15 + -1;
                        do {
                          pLVar4 = &((lyext_substmt *)pcVar15)->stmt;
                          pcVar15 = (char *)((long)&((lyext_substmt *)pcVar15)->stmt + 1);
                        } while ((*(byte *)((long)*ppuVar8 +
                                           (long)(char)*(byte *)((long)pLVar4 + 1) * 2 + 1) & 0x20)
                                 != 0);
                        iVar5 = strcmp(pcVar15,"unbounded");
                        if (iVar5 == 0) {
                          info = (lyext_substmt *)0x0;
                        }
                        else {
                          endptr = (char *)__errno_location();
                          *(int *)endptr = 0;
                          local_78 = (char *)0x0;
                          info = (lyext_substmt *)strtoul(pcVar15,&local_78,10);
                          if (((*local_78 != '\0') ||
                              ((char)((lyext_substmt *)pcVar15)->stmt == LY_STMT_OUTPUT)) ||
                             ((*(int *)endptr != 0 ||
                              (&info[-0xaaaaaab].offset < (size_t *)0xffffffff00000001))))
                          goto LAB_0013040d;
                        }
LAB_0012f7d5:
                        i = (uint8_t)uVar23;
                        type = LYEXT_SUBSTMT_MAX;
LAB_0012f9ce:
                        iVar5 = lyp_yin_parse_subnode_ext
                                          (mod,local_48,LYEXT_PAR_EXTINST,node,type,i,local_50);
                        if (iVar5 != 0) {
                          return local_34;
                        }
                        puVar9 = (undefined4 *)malloc(4);
                        *(undefined4 **)local_40 = puVar9;
                        if (puVar9 == (undefined4 *)0x0) goto LAB_001303a9;
                        *puVar9 = (int)info;
                        if (local_58 == (lyext_substmt *)0x0) goto LAB_0012eec1;
                        pvVar16 = *(void **)local_58;
LAB_0012fa10:
                        lVar26 = (long)(int)uVar23;
                        pvVar16 = realloc(pvVar16,lVar26 * 8 + 0x10);
                        local_80 = local_58;
joined_r0x0012fc43:
                        if (pvVar16 != (void *)0x0) {
                          *(void **)local_80 = pvVar16;
                          *(undefined8 *)((long)pvVar16 + lVar26 * 8 + 8) = 0;
                          goto LAB_0012eec1;
                        }
                        goto LAB_001303a9;
                      }
                    }
                    else {
                      iVar5 = strcmp(pcVar15,"min-elements");
                      if (iVar5 == 0) {
                        local_40 = (lyext_substmt *)
                                   lys_ext_complex_get_substmt
                                             (LY_STMT_MIN,(lys_ext_instance_complex *)local_48,
                                              &local_68);
                        if (local_40 != (lyext_substmt *)0x0) {
                          pvVar16 = *(void **)local_40;
                          if (local_68->cardinality < LY_STMT_CARD_SOME) {
                            if (pvVar16 != (void *)0x0) goto LAB_00130420;
                            local_58 = (lyext_substmt *)0x0;
                            uVar23 = 0;
                          }
                          else {
                            if (pvVar16 == (void *)0x0) {
                              pvVar16 = malloc(0x10);
                              *(void **)local_40 = pvVar16;
                              if (pvVar16 == (void *)0x0) goto LAB_001303a9;
                              uVar23 = 0;
                            }
                            else {
                              lVar26 = 0;
                              do {
                                lVar1 = lVar26 * 8;
                                lVar26 = lVar26 + 1;
                              } while (*(long *)((long)pvVar16 + lVar1) != 0);
                              uVar23 = (int)lVar26 - 1;
                            }
                            local_58 = local_40;
                            local_40 = (lyext_substmt *)((long)pvVar16 + (ulong)uVar23 * 8);
                          }
                          pcVar15 = lyxml_get_attr(node,"value",(char *)0x0);
                          if (pcVar15 == (char *)0x0) goto LAB_001303d5;
                          ppuVar8 = __ctype_b_loc();
                          pcVar15 = pcVar15 + -1;
                          do {
                            pLVar4 = &((lyext_substmt *)pcVar15)->stmt;
                            pcVar15 = (char *)((long)&((lyext_substmt *)pcVar15)->stmt + 1);
                          } while ((*(byte *)((long)*ppuVar8 +
                                             (long)(char)*(byte *)((long)pLVar4 + 1) * 2 + 1) & 0x20
                                   ) != 0);
                          endptr = (char *)__errno_location();
                          *(int *)endptr = 0;
                          local_78 = (char *)0x0;
                          info = (lyext_substmt *)strtoul(pcVar15,&local_78,10);
                          if (((*local_78 != '\0') ||
                              ((char)((lyext_substmt *)pcVar15)->stmt == LY_STMT_OUTPUT)) ||
                             ((*(int *)endptr != 0 || ((ulong)info >> 0x20 != 0)))) {
LAB_0013040d:
                            plVar21 = mod->ctx;
                            pcVar22 = node->name;
                            ecode = LYE_INARG;
                            goto LAB_001303a0;
                          }
                          goto LAB_0012f7d5;
                        }
                      }
                      else {
                        iVar5 = strcmp(pcVar15,"value");
                        if (iVar5 == 0) {
                          local_40 = (lyext_substmt *)
                                     lys_ext_complex_get_substmt
                                               (LY_STMT_VALUE,(lys_ext_instance_complex *)local_48,
                                                &local_68);
                          if (local_40 != (lyext_substmt *)0x0) {
                            pvVar16 = *(void **)local_40;
                            if (local_68->cardinality < LY_STMT_CARD_SOME) {
                              if (pvVar16 != (void *)0x0) goto LAB_00130420;
                              local_58 = (lyext_substmt *)0x0;
                              uVar23 = 0;
                            }
                            else {
                              if (pvVar16 == (void *)0x0) {
                                pvVar16 = malloc(0x10);
                                *(void **)local_40 = pvVar16;
                                if (pvVar16 == (void *)0x0) goto LAB_001303a9;
                                uVar23 = 0;
                              }
                              else {
                                lVar26 = 0;
                                do {
                                  lVar1 = lVar26 * 8;
                                  lVar26 = lVar26 + 1;
                                } while (*(long *)((long)pvVar16 + lVar1) != 0);
                                uVar23 = (int)lVar26 - 1;
                              }
                              local_58 = local_40;
                              local_40 = (lyext_substmt *)((long)pvVar16 + (ulong)uVar23 * 8);
                            }
                            pcVar15 = lyxml_get_attr(node,"value",(char *)0x0);
                            if (pcVar15 == (char *)0x0) goto LAB_001303d5;
                            ppuVar8 = __ctype_b_loc();
                            pcVar15 = pcVar15 + -1;
                            do {
                              pLVar4 = &((lyext_substmt *)pcVar15)->stmt;
                              pcVar15 = (char *)((long)&((lyext_substmt *)pcVar15)->stmt + 1);
                            } while ((*(byte *)((long)*ppuVar8 +
                                               (long)(char)*(byte *)((long)pLVar4 + 1) * 2 + 1) &
                                     0x20) != 0);
                            info = (lyext_substmt *)strtoll(pcVar15,(char **)0x0,10);
                            if ((lyext_substmt *)(long)(int)info != info) goto LAB_0013040d;
                            i = (uint8_t)uVar23;
                            type = LYEXT_SUBSTMT_VALUE;
                            goto LAB_0012f9ce;
                          }
                        }
                        else {
                          iVar5 = strcmp(pcVar15,"position");
                          if (iVar5 == 0) {
                            local_40 = (lyext_substmt *)
                                       lys_ext_complex_get_substmt
                                                 (LY_STMT_POSITION,
                                                  (lys_ext_instance_complex *)local_48,&local_68);
                            if (local_40 != (lyext_substmt *)0x0) {
                              pvVar16 = *(void **)local_40;
                              if (local_68->cardinality < LY_STMT_CARD_SOME) {
                                if (pvVar16 != (void *)0x0) goto LAB_00130420;
                                local_58 = (lyext_substmt *)0x0;
                                uVar23 = 0;
                              }
                              else {
                                if (pvVar16 == (void *)0x0) {
                                  pvVar16 = malloc(0x10);
                                  *(void **)local_40 = pvVar16;
                                  if (pvVar16 == (void *)0x0) goto LAB_001303a9;
                                  uVar23 = 0;
                                }
                                else {
                                  lVar26 = 0;
                                  do {
                                    lVar1 = lVar26 * 8;
                                    lVar26 = lVar26 + 1;
                                  } while (*(long *)((long)pvVar16 + lVar1) != 0);
                                  uVar23 = (int)lVar26 - 1;
                                }
                                local_58 = local_40;
                                local_40 = (lyext_substmt *)((long)pvVar16 + (ulong)uVar23 * 8);
                              }
                              pcVar15 = lyxml_get_attr(node,"value",(char *)0x0);
                              if ((lyext_substmt *)pcVar15 == (lyext_substmt *)0x0)
                              goto LAB_001303d5;
                              info = (lyext_substmt *)strtoll(pcVar15,(char **)0x0,10);
                              if ((ulong)info >> 0x20 != 0) goto LAB_0013040d;
                              i = (uint8_t)uVar23;
                              type = LYEXT_SUBSTMT_POSITION;
                              goto LAB_0012f9ce;
                            }
                          }
                          else {
                            iVar5 = strcmp(pcVar15,"module");
                            if (iVar5 == 0) {
                              ppvVar14 = yin_getplace_for_extcomplex_struct
                                                   (node,(lys_ext_instance_complex *)local_48,
                                                    LY_STMT_MODULE);
                              if (ppvVar14 == (void **)0x0) {
                                return local_34;
                              }
                              plVar13 = yin_read_module_(mod->ctx,node,(char *)0x0,
                                                         *(uint *)&mod->field_0x40 >> 7 & 1);
                              *ppvVar14 = plVar13;
                              goto LAB_0012f6ec;
                            }
                            iVar5 = strcmp(pcVar15,"when");
                            if (iVar5 == 0) {
                              plVar10 = (lyext_substmt *)
                                        lys_ext_complex_get_substmt
                                                  (LY_STMT_WHEN,(lys_ext_instance_complex *)local_48
                                                   ,&local_68);
                              if (plVar10 != (lyext_substmt *)0x0) {
                                pvVar16 = *(void **)plVar10;
                                if (local_68->cardinality < LY_STMT_CARD_SOME) {
                                  if (pvVar16 != (void *)0x0) goto LAB_00130420;
                                  local_40 = (lyext_substmt *)0x0;
                                  uVar23 = 0;
                                  plVar24 = plVar10;
                                }
                                else {
                                  if (pvVar16 == (void *)0x0) {
                                    pvVar16 = malloc(0x10);
                                    *(void **)plVar10 = pvVar16;
                                    if (pvVar16 == (void *)0x0) goto LAB_001303a9;
                                    uVar23 = 0;
                                  }
                                  else {
                                    lVar26 = 0;
                                    do {
                                      lVar1 = lVar26 * 8;
                                      lVar26 = lVar26 + 1;
                                    } while (*(long *)((long)pvVar16 + lVar1) != 0);
                                    uVar23 = (int)lVar26 - 1;
                                  }
                                  plVar24 = (lyext_substmt *)((long)pvVar16 + (ulong)uVar23 * 8);
                                  local_40 = plVar10;
                                }
                                plVar11 = read_yin_when(mod,node,local_50);
                                *(lys_when **)plVar24 = plVar11;
                                if (plVar11 == (lys_when *)0x0) {
                                  return local_34;
                                }
LAB_0012fd0c:
                                if (local_40 == (lyext_substmt *)0x0) goto LAB_0012eec1;
                                lVar26 = (long)(int)uVar23;
                                pvVar16 = realloc(*(void **)local_40,lVar26 * 8 + 0x10);
                                local_80 = local_40;
                                goto joined_r0x0012fc43;
                              }
                            }
                            else {
                              iVar5 = strcmp(pcVar15,"revision");
                              if (iVar5 == 0) {
                                local_58 = (lyext_substmt *)
                                           lys_ext_complex_get_substmt
                                                     (LY_STMT_REVISION,
                                                      (lys_ext_instance_complex *)local_48,&local_68
                                                     );
                                if (local_58 != (lyext_substmt *)0x0) {
                                  pvVar16 = *(void **)local_58;
                                  if (local_68->cardinality < LY_STMT_CARD_SOME) {
                                    if (pvVar16 != (void *)0x0) goto LAB_00130420;
                                    info = (lyext_substmt *)0x0;
                                    local_40 = (lyext_substmt *)0x0;
                                  }
                                  else {
                                    if (pvVar16 == (void *)0x0) {
                                      pvVar16 = malloc(0x10);
                                      *(void **)local_58 = pvVar16;
                                      if (pvVar16 == (void *)0x0) goto LAB_001303a9;
                                      local_40 = (lyext_substmt *)0x0;
                                    }
                                    else {
                                      local_40 = (lyext_substmt *)0x0;
                                      do {
                                        lVar26 = (long)local_40 * 8;
                                        local_40 = (lyext_substmt *)((long)local_40 + 1);
                                      } while (*(long *)((long)pvVar16 + lVar26) != 0);
                                      local_40 = (lyext_substmt *)(ulong)((int)local_40 - 1);
                                    }
                                    info = local_58;
                                    local_58 = (lyext_substmt *)((long)pvVar16 + (long)local_40 * 8)
                                    ;
                                  }
                                  rev = (lys_revision *)calloc(1,0x28);
                                  *(lys_revision **)local_58 = rev;
                                  if (rev == (lys_revision *)0x0) goto LAB_001303a9;
                                  iVar5 = fill_yin_revision(mod,node,rev,local_50);
                                  if (iVar5 != 0) {
                                    return local_34;
                                  }
                                  if (info == (lyext_substmt *)0x0) goto LAB_0012eec1;
                                  endptr = (char *)((ulong)local_40 & 0xffffffff);
                                  for (pcVar15 = (char *)0x0; endptr != pcVar15;
                                      pcVar15 = pcVar15 + 1) {
                                    iVar5 = strcmp(*(char **)((long)*(void **)info +
                                                             (long)pcVar15 * 8),*(char **)local_58);
                                    if (iVar5 == 0) {
                                      ly_log(mod->ctx,LY_LLWRN,LY_SUCCESS,
                                             "Module\'s revisions are not unique (%s).");
                                    }
                                  }
                                  lVar26 = (long)(int)local_40;
                                  pvVar16 = realloc(*(void **)info,lVar26 * 8 + 0x10);
                                  local_80 = info;
                                  goto joined_r0x0012fc43;
                                }
                              }
                              else {
                                iVar5 = strcmp(pcVar15,"unique");
                                if (iVar5 != 0) {
                                  iVar5 = strcmp(pcVar15,"action");
                                  if (iVar5 == 0) {
                                    pplVar12 = yin_getplace_for_extcomplex_node
                                                         (node,(lys_ext_instance_complex *)local_48,
                                                          LY_STMT_ACTION);
                                    if (pplVar12 == (lys_node **)0x0) {
                                      return local_34;
                                    }
                                    plVar13 = (lys_module *)
                                              read_yin_rpc_action(mod,local_48,node,1,local_50);
                                    goto LAB_0012f6ec;
                                  }
                                  iVar5 = strcmp(pcVar15,"anydata");
                                  if (iVar5 == 0) {
                                    pplVar12 = yin_getplace_for_extcomplex_node
                                                         (node,(lys_ext_instance_complex *)local_48,
                                                          LY_STMT_ANYDATA);
                                    if (pplVar12 == (lys_node **)0x0) {
                                      return local_34;
                                    }
                                    type_00 = LYS_ANYDATA;
LAB_0012fc77:
                                    plVar13 = (lys_module *)
                                              read_yin_anydata(mod,local_48,node,type_00,1,local_50)
                                    ;
                                  }
                                  else {
                                    iVar5 = strcmp(pcVar15,"anyxml");
                                    if (iVar5 == 0) {
                                      pplVar12 = yin_getplace_for_extcomplex_node
                                                           (node,(lys_ext_instance_complex *)
                                                                 local_48,LY_STMT_ANYXML);
                                      if (pplVar12 == (lys_node **)0x0) {
                                        return local_34;
                                      }
                                      type_00 = LYS_ANYXML;
                                      goto LAB_0012fc77;
                                    }
                                    iVar5 = strcmp(pcVar15,"case");
                                    if (iVar5 == 0) {
                                      pplVar12 = yin_getplace_for_extcomplex_node
                                                           (node,(lys_ext_instance_complex *)
                                                                 local_48,LY_STMT_CASE);
                                      if (pplVar12 == (lys_node **)0x0) {
                                        return local_34;
                                      }
                                      plVar13 = (lys_module *)
                                                read_yin_case(mod,local_48,node,1,local_50);
                                    }
                                    else {
                                      iVar5 = strcmp(pcVar15,"choice");
                                      if (iVar5 == 0) {
                                        pplVar12 = yin_getplace_for_extcomplex_node
                                                             (node,(lys_ext_instance_complex *)
                                                                   local_48,LY_STMT_CHOICE);
                                        if (pplVar12 == (lys_node **)0x0) {
                                          return local_34;
                                        }
                                        plVar13 = (lys_module *)
                                                  read_yin_choice(mod,local_48,node,1,local_50);
                                      }
                                      else {
                                        iVar5 = strcmp(pcVar15,"container");
                                        if (iVar5 == 0) {
                                          pplVar12 = yin_getplace_for_extcomplex_node
                                                               (node,(lys_ext_instance_complex *)
                                                                     local_48,LY_STMT_CONTAINER);
                                          if (pplVar12 == (lys_node **)0x0) {
                                            return local_34;
                                          }
                                          plVar13 = (lys_module *)
                                                    read_yin_container(mod,local_48,node,1,local_50)
                                          ;
                                        }
                                        else {
                                          iVar5 = strcmp(pcVar15,"grouping");
                                          if (iVar5 == 0) {
                                            pplVar12 = yin_getplace_for_extcomplex_node
                                                                 (node,(lys_ext_instance_complex *)
                                                                       local_48,LY_STMT_GROUPING);
                                            if (pplVar12 == (lys_node **)0x0) {
                                              return local_34;
                                            }
                                            plVar13 = (lys_module *)
                                                      read_yin_grouping(mod,local_48,node,1,local_50
                                                                       );
                                          }
                                          else {
                                            iVar5 = strcmp(pcVar15,"output");
                                            if (iVar5 == 0) {
                                              LVar20 = LY_STMT_OUTPUT;
                                            }
                                            else {
                                              iVar5 = strcmp(pcVar15,"input");
                                              if (iVar5 != 0) {
                                                iVar5 = strcmp(pcVar15,"leaf");
                                                if (iVar5 == 0) {
                                                  pplVar12 = yin_getplace_for_extcomplex_node
                                                                       (node,(
                                                  lys_ext_instance_complex *)local_48,LY_STMT_LEAF);
                                                  if (pplVar12 == (lys_node **)0x0) {
                                                    return local_34;
                                                  }
                                                  plVar13 = (lys_module *)
                                                            read_yin_leaf(mod,local_48,node,1,
                                                                          local_50);
                                                }
                                                else {
                                                  iVar5 = strcmp(pcVar15,"leaf-list");
                                                  if (iVar5 == 0) {
                                                    pplVar12 = yin_getplace_for_extcomplex_node
                                                                         (node,(
                                                  lys_ext_instance_complex *)local_48,
                                                  LY_STMT_LEAFLIST);
                                                  if (pplVar12 == (lys_node **)0x0) {
                                                    return local_34;
                                                  }
                                                  plVar13 = (lys_module *)
                                                            read_yin_leaflist(mod,local_48,node,1,
                                                                              local_50);
                                                  }
                                                  else {
                                                    iVar5 = strcmp(pcVar15,"list");
                                                    if (iVar5 == 0) {
                                                      pplVar12 = yin_getplace_for_extcomplex_node
                                                                           (node,(
                                                  lys_ext_instance_complex *)local_48,LY_STMT_LIST);
                                                  if (pplVar12 == (lys_node **)0x0) {
                                                    return local_34;
                                                  }
                                                  plVar13 = (lys_module *)
                                                            read_yin_list(mod,local_48,node,1,
                                                                          local_50);
                                                  }
                                                  else {
                                                    iVar5 = strcmp(pcVar15,"notification");
                                                    if (iVar5 == 0) {
                                                      pplVar12 = yin_getplace_for_extcomplex_node
                                                                           (node,(
                                                  lys_ext_instance_complex *)local_48,
                                                  LY_STMT_NOTIFICATION);
                                                  if (pplVar12 == (lys_node **)0x0) {
                                                    return local_34;
                                                  }
                                                  plVar13 = (lys_module *)
                                                            read_yin_notif(mod,local_48,node,1,
                                                                           local_50);
                                                  }
                                                  else {
                                                    iVar5 = strcmp(pcVar15,"uses");
                                                    if (iVar5 != 0) {
                                                      iVar5 = strcmp(pcVar15,"length");
                                                      if (iVar5 == 0) {
                                                        local_40 = (lyext_substmt *)
                                                                   lys_ext_complex_get_substmt
                                                                             (LY_STMT_LENGTH,
                                                                              (
                                                  lys_ext_instance_complex *)local_48,&local_68);
                                                  if (local_40 == (lyext_substmt *)0x0)
                                                  goto LAB_001303fa;
                                                  pvVar16 = *(void **)local_40;
                                                  if (local_68->cardinality < LY_STMT_CARD_SOME) {
LAB_0012ff77:
                                                    if (pvVar16 != (void *)0x0) goto LAB_00130420;
                                                    local_58 = (lyext_substmt *)0x0;
                                                    uVar23 = 0;
                                                  }
                                                  else {
                                                    if (pvVar16 == (void *)0x0) {
LAB_0013008d:
                                                      pvVar16 = malloc(0x10);
                                                      *(void **)local_40 = pvVar16;
                                                      if (pvVar16 == (void *)0x0) goto LAB_001303a9;
                                                      uVar23 = 0;
                                                    }
                                                    else {
                                                      lVar26 = 0;
                                                      do {
                                                        lVar1 = lVar26 * 8;
                                                        lVar26 = lVar26 + 1;
                                                      } while (*(long *)((long)pvVar16 + lVar1) != 0
                                                              );
LAB_0012fff0:
                                                      uVar23 = (int)lVar26 - 1;
                                                    }
                                                    local_58 = local_40;
                                                    local_40 = (lyext_substmt *)
                                                               ((long)pvVar16 + (ulong)uVar23 * 8);
                                                  }
                                                  pcVar15 = lyxml_get_attr(node,"value",(char *)0x0)
                                                  ;
                                                  if (pcVar15 == (char *)0x0) goto LAB_001303d5;
                                                  pvVar16 = calloc(1,0x38);
                                                  *(void **)local_40 = pvVar16;
                                                  plVar21 = mod->ctx;
                                                  if (pvVar16 == (void *)0x0) goto LAB_001303ac;
                                                  pcVar15 = lydict_insert(plVar21,pcVar15,0);
                                                  **(undefined8 **)local_40 = pcVar15;
                                                  iVar5 = read_restr_substmt(mod,*(lys_restr **)
                                                                                  local_40,node,
                                                                             local_50);
                                                  if (iVar5 != 0) {
                                                    return local_34;
                                                  }
                                                  if (local_58 == (lyext_substmt *)0x0)
                                                  goto LAB_0012eec1;
                                                  pvVar16 = *(void **)local_58;
                                                  goto LAB_0012fa10;
                                                  }
                                                  iVar5 = strcmp(pcVar15,"must");
                                                  if (iVar5 == 0) {
                                                    ppvVar14 = yin_getplace_for_extcomplex_struct
                                                                         (node,(
                                                  lys_ext_instance_complex *)local_48,LY_STMT_MUST);
                                                  if (ppvVar14 == (void **)0x0) {
                                                    return local_34;
                                                  }
                                                  must = (lys_restr *)calloc(1,0x38);
                                                  *ppvVar14 = must;
                                                  if (must != (lys_restr *)0x0) {
                                                    iVar5 = fill_yin_must(mod,node,must,local_50);
                                                    goto LAB_0012eeb9;
                                                  }
LAB_001303a9:
                                                  plVar21 = mod->ctx;
LAB_001303ac:
                                                  local_34 = 1;
                                                  ly_log(plVar21,LY_LLERR,LY_EMEM,
                                                         "Memory allocation failed (%s()).",
                                                         "lyp_yin_parse_complex_ext");
                                                  return local_34;
                                                  }
                                                  iVar5 = strcmp(pcVar15,"pattern");
                                                  if (iVar5 == 0) {
                                                    local_58 = (lyext_substmt *)
                                                               lys_ext_complex_get_substmt
                                                                         (LY_STMT_PATTERN,
                                                                          (lys_ext_instance_complex
                                                                           *)local_48,&local_68);
                                                    if (local_58 != (lyext_substmt *)0x0) {
                                                      pvVar16 = *(void **)local_58;
                                                      if (local_68->cardinality < LY_STMT_CARD_SOME)
                                                      {
                                                        if (pvVar16 != (void *)0x0)
                                                        goto LAB_00130420;
                                                        local_80 = (lyext_substmt *)0x0;
                                                        uVar23 = 0;
                                                      }
                                                      else {
                                                        if (pvVar16 == (void *)0x0) {
                                                          pvVar16 = malloc(0x10);
                                                          *(void **)local_58 = pvVar16;
                                                          if (pvVar16 == (void *)0x0)
                                                          goto LAB_001303a9;
                                                          uVar23 = 0;
                                                        }
                                                        else {
                                                          lVar26 = 0;
                                                          do {
                                                            lVar1 = lVar26 * 8;
                                                            lVar26 = lVar26 + 1;
                                                          } while (*(long *)((long)pvVar16 + lVar1)
                                                                   != 0);
                                                          uVar23 = (int)lVar26 - 1;
                                                        }
                                                        local_80 = local_58;
                                                        local_58 = (lyext_substmt *)
                                                                   ((long)pvVar16 +
                                                                   (ulong)uVar23 * 8);
                                                      }
                                                      info = (lyext_substmt *)
                                                             lyxml_get_attr(node,"value",(char *)0x0
                                                                           );
                                                      plVar21 = mod->ctx;
                                                      if (info == (lyext_substmt *)0x0)
                                                      goto LAB_001303d8;
                                                      iVar5 = lyp_check_pattern(plVar21,(char *)info
                                                                                ,(pcre **)0x0);
                                                      if (iVar5 != 0) {
                                                        return local_34;
                                                      }
                                                      puVar17 = (undefined8 *)calloc(1,0x38);
                                                      *(undefined8 **)local_58 = puVar17;
                                                      if (puVar17 != (undefined8 *)0x0) {
                                                        if ((mod->field_0x40 & 0xc) == 0) {
                                                          endptr = (char *)CONCAT71(endptr._1_7_,6);
                                                        }
                                                        else {
                                                          endptr = (char *)CONCAT71(endptr._1_7_,6);
                                                          local_40 = (lyext_substmt *)0x0;
                                                          pplVar25 = &node->child;
                                                          while (elem = *pplVar25,
                                                                elem != (lyxml_elem *)0x0) {
                                                            if (((elem->ns != (lyxml_ns *)0x0) &&
                                                                (iVar5 = strcmp(elem->ns->value,
                                                                                                                                                                
                                                  "urn:ietf:params:xml:ns:yang:yin:1"), iVar5 == 0))
                                                  && (iVar5 = strcmp(elem->name,"modifier"),
                                                     iVar5 == 0)) {
                                                    if (local_40 != (lyext_substmt *)0x0) {
                                                      plVar21 = mod->ctx;
                                                      pcVar22 = node->name;
                                                      pcVar15 = "modifier";
                                                      goto LAB_00130399;
                                                    }
                                                    local_40 = (lyext_substmt *)
                                                               lyxml_get_attr(elem,"value",
                                                                              (char *)0x0);
                                                    if (local_40 == (lyext_substmt *)0x0) {
                                                      plVar21 = mod->ctx;
                                                      pcVar22 = elem->name;
                                                      goto LAB_001303dc;
                                                    }
                                                    iVar5 = strcmp((char *)local_40,"invert-match");
                                                    if (iVar5 != 0) {
                                                      plVar21 = mod->ctx;
                                                      pcVar22 = "modifier";
                                                      ecode = LYE_INARG;
                                                      pcVar15 = (char *)local_40;
                                                      goto LAB_001303a0;
                                                    }
                                                    iVar5 = lyp_yin_parse_subnode_ext
                                                                      (mod,*(void **)local_58,
                                                                       LYEXT_PAR_RESTR,elem,
                                                                       LYEXT_SUBSTMT_MODIFIER,'\0',
                                                                       local_50);
                                                    endptr = (char *)CONCAT71(endptr._1_7_,0x15);
                                                    if (iVar5 != 0) {
                                                      return local_34;
                                                    }
                                                  }
                                                  pplVar25 = &elem->next;
                                                  }
                                                  puVar17 = *(undefined8 **)local_58;
                                                  }
                                                  sVar18 = strlen((char *)info);
                                                  pvVar16 = malloc(sVar18 + 2);
                                                  plVar10 = local_58;
                                                  *puVar17 = pvVar16;
                                                  if ((undefined1 *)**(long **)local_58 !=
                                                      (undefined1 *)0x0) {
                                                    *(undefined1 *)**(long **)local_58 =
                                                         endptr._0_1_;
                                                    strcpy((char *)(**(long **)local_58 + 1),
                                                           (char *)info);
                                                    lydict_insert_zc(mod->ctx,(char *)**(undefined8
                                                                                         **)plVar10)
                                                    ;
                                                    iVar5 = read_restr_substmt(mod,*(lys_restr **)
                                                                                    plVar10,node,
                                                                               local_50);
                                                    if (iVar5 != 0) {
                                                      return local_34;
                                                    }
                                                    if (local_80 == (lyext_substmt *)0x0)
                                                    goto LAB_0012eec1;
                                                    lVar26 = (long)(int)uVar23;
                                                    pvVar16 = realloc(*(void **)local_80,
                                                                      lVar26 * 8 + 0x10);
                                                    goto joined_r0x0012fc43;
                                                  }
                                                  }
                                                  goto LAB_001303a9;
                                                  }
                                                  }
                                                  else {
                                                    iVar5 = strcmp(pcVar15,"range");
                                                    if (iVar5 != 0) {
                                                      plVar21 = mod->ctx;
                                                      pLVar6 = ly_errno_glob_address();
                                                      ly_log(plVar21,LY_LLERR,*pLVar6,
                                                                                                                          
                                                  "Extension\'s substatement \"%s\" not supported.")
                                                  ;
                                                  goto LAB_0012eec1;
                                                  }
                                                  local_40 = (lyext_substmt *)
                                                             lys_ext_complex_get_substmt
                                                                       (LY_STMT_RANGE,
                                                                        (lys_ext_instance_complex *)
                                                                        local_48,&local_68);
                                                  if (local_40 != (lyext_substmt *)0x0) {
                                                    pvVar16 = *(void **)local_40;
                                                    if (LY_STMT_CARD_MAND < local_68->cardinality) {
                                                      if (pvVar16 == (void *)0x0) goto LAB_0013008d;
                                                      lVar26 = 0;
                                                      do {
                                                        lVar1 = lVar26 * 8;
                                                        lVar26 = lVar26 + 1;
                                                      } while (*(long *)((long)pvVar16 + lVar1) != 0
                                                              );
                                                      goto LAB_0012fff0;
                                                    }
                                                    goto LAB_0012ff77;
                                                  }
                                                  }
                                                  goto LAB_001303fa;
                                                  }
                                                  pplVar12 = yin_getplace_for_extcomplex_node
                                                                       (node,(
                                                  lys_ext_instance_complex *)local_48,LY_STMT_USES);
                                                  if (pplVar12 == (lys_node **)0x0) {
                                                    return local_34;
                                                  }
                                                  plVar13 = (lys_module *)
                                                            read_yin_uses(mod,local_48,node,1,
                                                                          local_50);
                                                  }
                                                  }
                                                  }
                                                }
                                                goto LAB_0012f6ec;
                                              }
                                              LVar20 = LY_STMT_INPUT;
                                            }
                                            pplVar12 = yin_getplace_for_extcomplex_node
                                                                 (node,(lys_ext_instance_complex *)
                                                                       local_48,LVar20);
                                            if (pplVar12 == (lys_node **)0x0) {
                                              return local_34;
                                            }
                                            plVar13 = (lys_module *)
                                                      read_yin_input_output
                                                                (mod,local_48,node,1,local_50);
                                          }
                                        }
                                      }
                                    }
                                  }
LAB_0012f6ec:
                                  if (plVar13 == (lys_module *)0x0) {
                                    return local_34;
                                  }
                                  goto LAB_0012eec1;
                                }
                                plVar10 = (lyext_substmt *)
                                          lys_ext_complex_get_substmt
                                                    (LY_STMT_UNIQUE,
                                                     (lys_ext_instance_complex *)local_48,&local_68)
                                ;
                                if (plVar10 != (lyext_substmt *)0x0) {
                                  pvVar16 = *(void **)plVar10;
                                  if (local_68->cardinality < LY_STMT_CARD_SOME) {
                                    if (pvVar16 != (void *)0x0) goto LAB_00130420;
                                    local_40 = (lyext_substmt *)0x0;
                                    uVar23 = 0;
                                    plVar24 = plVar10;
                                  }
                                  else {
                                    if (pvVar16 == (void *)0x0) {
                                      pvVar16 = malloc(0x10);
                                      *(void **)plVar10 = pvVar16;
                                      if (pvVar16 == (void *)0x0) goto LAB_001303a9;
                                      uVar23 = 0;
                                    }
                                    else {
                                      lVar26 = 0;
                                      do {
                                        lVar1 = lVar26 * 8;
                                        lVar26 = lVar26 + 1;
                                      } while (*(long *)((long)pvVar16 + lVar1) != 0);
                                      uVar23 = (int)lVar26 - 1;
                                    }
                                    plVar24 = (lyext_substmt *)((long)pvVar16 + (ulong)uVar23 * 8);
                                    local_40 = plVar10;
                                  }
                                  unique = (lys_unique *)calloc(1,0x10);
                                  *(lys_unique **)plVar24 = unique;
                                  if (unique == (lys_unique *)0x0) goto LAB_001303a9;
                                  iVar5 = fill_yin_unique(mod,local_48,node,unique,local_50);
                                  if (iVar5 != 0) {
                                    return local_34;
                                  }
                                  iVar5 = lyp_yin_parse_subnode_ext
                                                    (mod,local_48,LYEXT_PAR_EXTINST,node,
                                                     LYEXT_SUBSTMT_UNIQUE,(uint8_t)uVar23,local_50);
                                  if (iVar5 != 0) {
                                    return local_34;
                                  }
                                  goto LAB_0012fd0c;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
LAB_001303fa:
                  plVar21 = mod->ctx;
                  pcVar15 = node->name;
                  pcVar22 = node->parent->name;
                  ecode = LYE_INCHILDSTMT;
LAB_001303a0:
                  ly_vlog(plVar21,ecode,LY_VLOG_NONE,(void *)0x0,pcVar15,pcVar22);
                  return local_34;
                }
                LVar20 = LY_STMT_MODIFIER;
                pcVar15 = "invert-match";
                pcVar22 = (char *)0x0;
              }
              iVar5 = yin_parse_extcomplex_bool
                                (mod,node,(lys_ext_instance_complex *)local_48,LVar20,pcVar15,
                                 pcVar22,local_50);
              goto LAB_0012eeb9;
            }
            LVar20 = LY_STMT_ORGANIZATION;
          }
          goto LAB_0012ee6e;
        }
        LVar20 = LY_STMT_DEFAULT;
LAB_0012f1e1:
        iVar5 = 0;
LAB_0012f1e5:
        pcVar15 = "value";
        goto LAB_0012eeb4;
      }
      ppvVar14 = yin_getplace_for_extcomplex_struct
                           (node,(lys_ext_instance_complex *)ext_00,LY_STMT_TYPEDEF);
      if (ppvVar14 == (void **)0x0) {
        return local_34;
      }
      tpdf = (lys_tpdf *)calloc(1,0x80);
      *ppvVar14 = tpdf;
      if (tpdf == (lys_tpdf *)0x0) goto LAB_001303a9;
      iVar5 = fill_yin_typedef(mod,local_48,node,tpdf,local_50);
      goto LAB_0012eeb9;
    }
    ppvVar14 = yin_getplace_for_extcomplex_struct
                         (node,(lys_ext_instance_complex *)ext_00,LY_STMT_TYPE);
    if (ppvVar14 == (void **)0x0) {
      return local_34;
    }
    pvVar16 = calloc(1,0x40);
    *ppvVar14 = pvVar16;
    plVar21 = mod->ctx;
    if (pvVar16 == (void *)0x0) goto LAB_001303ac;
    lyxml_unlink(plVar21,node);
    *(lyxml_elem **)((long)*ppvVar14 + 0x10) = node;
    *(lys_node **)((long)*ppvVar14 + 0x18) = local_48;
    iVar5 = unres_schema_add_node(mod,local_50,*ppvVar14,UNRES_TYPE_DER_EXT,(lys_node *)0x0);
    node = plVar2;
    if (iVar5 == -1) {
      *(undefined8 *)((long)*ppvVar14 + 0x10) = 0;
      return local_34;
    }
  } while( true );
}

Assistant:

int
lyp_yin_parse_complex_ext(struct lys_module *mod, struct lys_ext_instance_complex *ext, struct lyxml_elem *yin,
                          struct unres_schema *unres)
{
    struct lyxml_elem *next, *node, *child;
    struct lys_type **type;
    void **pp, *p, *reallocated;
    const char *value, *name;
    char *endptr, modifier;
    struct lyext_substmt *info;
    long int v;
    long long int ll;
    unsigned long u;
    int i, j;

#define YIN_STORE_VALUE(TYPE, FROM, TO)           \
    *(TYPE **)TO = malloc(sizeof(TYPE));          \
    if (!*(TYPE **)TO) { LOGMEM(mod->ctx); goto error; }    \
    (**(TYPE **)TO) = (TYPE)FROM;

#define YIN_EXTCOMPLEX_GETPLACE(STMT, TYPE)                                          \
    p = lys_ext_complex_get_substmt(STMT, ext, &info);                               \
    if (!p) {                                                                        \
        LOGVAL(mod->ctx, LYE_INCHILDSTMT, LY_VLOG_NONE, NULL, node->name, node->parent->name); \
        goto error;                                                                  \
    }                                                                                \
    if (info->cardinality < LY_STMT_CARD_SOME && (*(TYPE*)p)) {                      \
        LOGVAL(mod->ctx, LYE_TOOMANY, LY_VLOG_NONE, NULL, node->name, node->parent->name);     \
        goto error;                                                                  \
    }                                                                                \
    pp = NULL; i = 0;                                                                \
    if (info->cardinality >= LY_STMT_CARD_SOME) {                                    \
        /* there can be multiple instances */                                        \
        pp = p;                                                                      \
        if (!(*pp)) {                                                                \
            *pp = malloc(2 * sizeof(TYPE)); /* allocate initial array */             \
            LY_CHECK_ERR_GOTO(!*pp, LOGMEM(mod->ctx), error);                        \
        } else {                                                                     \
            for (i = 0; (*(TYPE**)pp)[i]; i++);                                      \
        }                                                                            \
        p = &(*(TYPE**)pp)[i];                                                       \
    }